

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::GetProperty
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,Var originalInstance,JavascriptString *propertyNameString,
          Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  PropertyAttributes PVar1;
  unsigned_short uVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar3;
  bool bVar4;
  charcount_t cVar5;
  uint uVar6;
  BOOL BVar7;
  char16 *pcVar8;
  undefined4 *puVar9;
  Var pvVar10;
  RecyclableObject *pRVar11;
  Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
  *pEVar12;
  undefined1 local_50 [8];
  CharacterBuffer<char16_t> propertyName;
  
  propertyName._8_8_ = info;
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar5 = JavascriptString::GetLength(propertyNameString);
  bVar4 = PropertyRecord::IsPropertyNameNumeric(pcVar8,cVar5);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x4a7,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  pcVar8 = JavascriptString::GetString(propertyNameString);
  cVar5 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)local_50);
  local_50 = (undefined1  [8])pcVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_50);
  this_00 = (this->propertyMap).ptr;
  propertyName.string.ptr._0_4_ = cVar5;
  uVar6 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(CharacterBuffer<char16_t> *)local_50);
  if ((int)uVar6 < 0) {
    pRVar11 = ScriptContext::GetMissingPropertyResult(requestContext);
    *value = pRVar11;
    BVar7 = 0;
  }
  else {
    pEVar12 = (this_00->entries).ptr;
    BVar7 = 0;
    if ((*(PropertyAttributes *)
          ((long)&pEVar12[uVar6].
                  super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                  .
                  super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                  .
                  super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                  .
                  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                  .value + 1) & 0x18) == 0) {
      pEVar12 = pEVar12 + uVar6;
      uVar6 = (uint)*(unsigned_short *)
                     ((long)&(pEVar12->
                             super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                             ).
                             super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                             .
                             super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                             .
                             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                             .value + 2);
      if (uVar6 == 0xffff) {
        *value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
        BVar7 = 1;
      }
      else {
        pvVar10 = DynamicObject::GetSlot(instance,uVar6);
        *value = pvVar10;
        BVar7 = 1;
        if (propertyName._8_8_ != 0) {
          PVar1 = *(PropertyAttributes *)
                   ((long)&(pEVar12->
                           super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           ).
                           super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .
                           super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           .
                           super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                           .
                           super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           .value + 1);
          uVar2 = *(unsigned_short *)
                   ((long)&(pEVar12->
                           super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           ).
                           super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .
                           super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           .
                           super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                           .
                           super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           .value + 2);
          *(DynamicObject **)propertyName._8_8_ = instance;
          *(unsigned_short *)(propertyName._8_8_ + 8) = uVar2;
          *(PropertyAttributes *)(propertyName._8_8_ + 10) = PVar1;
          *(undefined1 *)(propertyName._8_8_ + 0xb) = 0;
          if ((*(byte *)&(pEVar12->
                         super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                         ).
                         super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .
                         super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                         .
                         super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                         .
                         super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                         .value & 6) != 2) {
            *(byte *)(propertyName._8_8_ + 0xc) = *(byte *)(propertyName._8_8_ + 0xc) & 0xfb;
          }
        }
      }
    }
  }
  return BVar7;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetProperty(DynamicObject* instance, Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            return GetPropertyFromDescriptor<false>(instance, descriptor, value, info);
        }

        *value = requestContext->GetMissingPropertyResult();
        return false;
    }